

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatticeCreator.hpp
# Opt level: O0

void __thiscall
OpenMD::LatticeBuilder<OpenMD::BCCLattice>::~LatticeBuilder
          (LatticeBuilder<OpenMD::BCCLattice> *this)

{
  void *in_RDI;
  
  ~LatticeBuilder((LatticeBuilder<OpenMD::BCCLattice> *)0x1f8ce8);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

LatticeBuilder(const std::string& ident) : LatticeCreator(ident) {}